

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O0

KFLOAT64 * __thiscall
KDIS::DATA_TYPE::WorldCoordinates::operator[](WorldCoordinates *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  WorldCoordinates *pWStack_18;
  KUINT16 i_local;
  WorldCoordinates *this_local;
  
  if (i == 0) {
    this_local = (WorldCoordinates *)&this->m_f64X;
  }
  else if (i == 1) {
    this_local = (WorldCoordinates *)&this->m_f64Y;
  }
  else {
    if (i != 2) {
      local_1a = i;
      pWStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (WorldCoordinates *)&this->m_f64Z;
  }
  return (KFLOAT64 *)this_local;
}

Assistant:

const KFLOAT64 &WorldCoordinates::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
        case 0:		return m_f64X;
        case 1:		return m_f64Y;
        case 2:		return m_f64Z;
        default:    throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}